

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# save.c
# Opt level: O1

void wr_player(void)

{
  bitflag v;
  long lVar1;
  ulong uVar2;
  
  wr_string(player->full_name);
  wr_string(player->died_from);
  wr_string(player->history);
  wr_string(player->race->name);
  wr_string(player->shape->name);
  wr_string(player->class->name);
  wr_byte((player->opts).name_suffix);
  wr_byte(player->hitdie);
  wr_s16b(player->age);
  wr_s16b(player->ht);
  wr_s16b(player->wt);
  wr_byte('\x05');
  lVar1 = 0;
  do {
    wr_s16b(player->stat_max[lVar1]);
    lVar1 = lVar1 + 1;
  } while (lVar1 != 5);
  lVar1 = 0;
  do {
    wr_s16b(player->stat_cur[lVar1]);
    lVar1 = lVar1 + 1;
  } while (lVar1 != 5);
  lVar1 = 0;
  do {
    wr_s16b(player->stat_map[lVar1]);
    lVar1 = lVar1 + 1;
  } while (lVar1 != 5);
  lVar1 = 0;
  do {
    wr_s16b(player->stat_birth[lVar1]);
    lVar1 = lVar1 + 1;
  } while (lVar1 != 5);
  wr_s16b(player->ht_birth);
  wr_s16b(player->wt_birth);
  wr_byte((uint8_t)(player->old_grid).y);
  wr_byte((uint8_t)(player->old_grid).x);
  wr_u32b(player->au_birth);
  wr_string((player->body).name);
  wr_u16b((player->body).count);
  if ((player->body).count != 0) {
    lVar1 = 0;
    uVar2 = 0;
    do {
      wr_u16b(*(uint16_t *)((long)&((player->body).slots)->type + lVar1));
      wr_string(*(char **)((long)&((player->body).slots)->name + lVar1));
      uVar2 = uVar2 + 1;
      lVar1 = lVar1 + 0x20;
    } while (uVar2 < (player->body).count);
  }
  wr_s16b(player->themed_level_appeared);
  wr_byte(player->themed_level);
  wr_byte(player->num_traps);
  wr_u32b(player->au);
  wr_u32b(player->max_exp);
  wr_u32b(player->exp);
  wr_u16b(player->exp_frac);
  wr_s16b(player->lev);
  wr_s16b(player->mhp);
  wr_s16b(player->chp);
  wr_u16b(player->chp_frac);
  wr_s16b(player->msp);
  wr_s16b(player->csp);
  wr_u16b(player->csp_frac);
  wr_s16b(player->max_lev);
  wr_s16b(player->max_depth);
  wr_s16b(player->home);
  lVar1 = 0;
  do {
    wr_s16b(player->recall[lVar1]);
    lVar1 = lVar1 + 1;
  } while (lVar1 != 4);
  wr_s16b(player->recall_pt);
  wr_s16b(player->place);
  wr_s16b(player->last_place);
  wr_byte(player->unignoring);
  wr_s16b(player->deep_descent);
  wr_s16b(player->energy);
  wr_s16b(player->word_recall);
  wr_byte('5');
  lVar1 = 0;
  do {
    wr_s16b(player->timed[lVar1]);
    lVar1 = lVar1 + 1;
  } while (lVar1 != 0x35);
  wr_u32b(player->total_energy);
  wr_u32b(player->resting_turn);
  uVar2 = 0;
  do {
    if (uVar2 < 10) {
      v = player->specialties[uVar2];
    }
    else {
      v = '\0';
    }
    wr_byte(v);
    uVar2 = uVar2 + 1;
  } while (uVar2 != 0x10);
  wr_s16b(player->speed_boost);
  wr_s16b(player->heighten_power);
  wr_byte(player->skip_cmd_coercion);
  wr_byte('\0');
  wr_byte('\0');
  wr_byte('\0');
  lVar1 = 1;
  do {
    wr_u32b(0);
    lVar1 = lVar1 + -1;
  } while (lVar1 == 0);
  return;
}

Assistant:

void wr_player(void)
{
	size_t i;

	wr_string(player->full_name);

	wr_string(player->died_from);

	wr_string(player->history);

	/* Race/Class/Gender/Spells */
	wr_string(player->race->name);
	wr_string(player->shape->name);
	wr_string(player->class->name);
	wr_byte(player->opts.name_suffix);

	wr_byte(player->hitdie);

	wr_s16b(player->age);
	wr_s16b(player->ht);
	wr_s16b(player->wt);

	/* Dump the stats (maximum and current and birth and swap-mapping) */
	wr_byte(STAT_MAX);
	for (i = 0; i < STAT_MAX; ++i) wr_s16b(player->stat_max[i]);
	for (i = 0; i < STAT_MAX; ++i) wr_s16b(player->stat_cur[i]);
	for (i = 0; i < STAT_MAX; ++i) wr_s16b(player->stat_map[i]);
	for (i = 0; i < STAT_MAX; ++i) wr_s16b(player->stat_birth[i]);

	wr_s16b(player->ht_birth);
	wr_s16b(player->wt_birth);
	wr_byte(player->old_grid.y);
	wr_byte(player->old_grid.x);
	wr_u32b(player->au_birth);

	/* Player body */
	wr_string(player->body.name);
	wr_u16b(player->body.count);
	for (i = 0; i < player->body.count; i++) {
		wr_u16b(player->body.slots[i].type);
		wr_string(player->body.slots[i].name);
	}

	wr_s16b(player->themed_level_appeared);
	wr_byte(player->themed_level);
	wr_byte(player->num_traps);

	wr_u32b(player->au);


	wr_u32b(player->max_exp);
	wr_u32b(player->exp);
	wr_u16b(player->exp_frac);
	wr_s16b(player->lev);

	wr_s16b(player->mhp);
	wr_s16b(player->chp);
	wr_u16b(player->chp_frac);

	wr_s16b(player->msp);
	wr_s16b(player->csp);
	wr_u16b(player->csp_frac);

	/* Max Player and Dungeon Levels */
	wr_s16b(player->max_lev);
	wr_s16b(player->max_depth);
	wr_s16b(player->home);

	/* Location info */
	for (i = 0; i < 4; i++) {
		wr_s16b(player->recall[i]);
	}
	wr_s16b(player->recall_pt);
	wr_s16b(player->place);
	wr_s16b(player->last_place);

	/* More info */
	wr_byte(player->unignoring);
	wr_s16b(player->deep_descent);

	wr_s16b(player->energy);
	wr_s16b(player->word_recall);

	/* Find the number of timed effects */
	wr_byte(TMD_MAX);

	/* Read all the effects, in a loop */
	for (i = 0; i < TMD_MAX; i++)
		wr_s16b(player->timed[i]);

	/* Total energy used so far */
	wr_u32b(player->total_energy);
	/* # of turns spent resting */
	wr_u32b(player->resting_turn);

	/* Learned specialties (assumes < 128 entries in list-player-flags.h) */
	for (i = 0; i < 16; i++) {
		if (i < PF_SIZE) {
			wr_byte(player->specialties[i]);
		} else {
			wr_byte(0L);
		}
	}

	/* More specialty info */
	wr_s16b(player->speed_boost);		/* Specialty Fury, Phasewalk */
	wr_s16b(player->heighten_power);	/* Specialty Heighten Magic */
	wr_byte(player->skip_cmd_coercion);
	wr_byte(0);
	wr_byte(0);
	wr_byte(0);

	/* Future use */
	for (i = 0; i < 2; i++) wr_u32b(0L);
}